

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O0

void startElementBnd(void *ctx,xmlChar *xname,xmlChar **atts)

{
  int iVar1;
  char *name;
  xmlChar **atts_local;
  xmlChar *xname_local;
  void *ctx_local;
  
  iVar1 = strcmp((char *)xname,"html");
  if (iVar1 != 0) {
    iVar1 = strcmp((char *)xname,"body");
    if (iVar1 != 0) {
      iVar1 = strcmp((char *)xname,"head");
      if (iVar1 != 0) {
        iVar1 = strcmp((char *)xname,"p");
        if (iVar1 != 0) {
          pushBoundaryCount = pushBoundaryCount + 1;
        }
      }
    }
  }
  xmlSAX2StartElement(ctx,xname,atts);
  return;
}

Assistant:

static void
startElementBnd(void *ctx, const xmlChar *xname, const xmlChar **atts) {
    const char *name = (const char *)xname;

    /* Some elements might be created automatically. */
    if ((strcmp(name, "html") != 0) &&
        (strcmp(name, "body") != 0) &&
        (strcmp(name, "head") != 0) &&
        (strcmp(name, "p") != 0)) {
        pushBoundaryCount++;
    }
    xmlSAX2StartElement(ctx, xname, atts);
}